

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::ChangeColumnTypeInfo::Deserialize(ChangeColumnTypeInfo *this,Deserializer *deserializer)

{
  ChangeColumnTypeInfo *this_00;
  pointer pCVar1;
  _Head_base<0UL,_duckdb::ChangeColumnTypeInfo_*,_false> local_20;
  
  this_00 = (ChangeColumnTypeInfo *)operator_new(0xb8);
  ChangeColumnTypeInfo(this_00);
  local_20._M_head_impl = this_00;
  pCVar1 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"column_name",&pCVar1->column_name);
  pCVar1 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,0x191,"target_type",&pCVar1->target_type);
  pCVar1 = unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
           ::operator->((unique_ptr<duckdb::ChangeColumnTypeInfo,_std::default_delete<duckdb::ChangeColumnTypeInfo>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0x192,"expression",&pCVar1->expression);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> ChangeColumnTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ChangeColumnTypeInfo>(new ChangeColumnTypeInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	deserializer.ReadProperty<LogicalType>(401, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(402, "expression", result->expression);
	return std::move(result);
}